

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,SwitchStmt *stmt)

{
  uint64_t uVar1;
  void *local_48;
  string var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)((long)&var.field_2 + 8),
             &(stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)var.field_2._8_8_ + 0xf8))(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  uVar1 = hash_64_fnv1a(local_48,(uint64_t)var._M_dataplus._M_p);
  var.field_2._8_8_ = uVar1 << ((byte)(this->super_IRVisitor).level & 0x3f) ^ 0x78dde6e5fd29f05a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,(unsigned_long *)(var.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void visit(SwitchStmt* stmt) override {
        constexpr uint64_t switch_signature = shift_const(0x9e3779b97f4a7c16, 2);
        auto var = stmt->target()->to_string();
        uint64_t hash = hash_64_fnv1a(var.c_str(), var.size()) << level;
        stmt_hashes_.emplace_back(switch_signature ^ hash);
    }